

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

cni_holder_base *
cs_impl::cni::construct_helper<cs_impl::any(*)(std::__cxx11::string_const&,std::_Ios_Openmode)>::
_construct<cs_impl::any(&)(std::__cxx11::string_const&,std::_Ios_Openmode),cs_impl::any,std::__cxx11::string_const&,std::_Ios_Openmode>
          (_func_any_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr__Ios_Openmode
           *val,_func_any_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr__Ios_Openmode
                *target_function)

{
  cni_holder<cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode),_cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  *this;
  _func_any_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr__Ios_Openmode
  *local_18;
  
  this = (cni_holder<cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode),_cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
          *)operator_new(0x28);
  local_18 = val;
  cni_holder<cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode),_cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  ::cni_holder(this,&local_18);
  return &this->super_cni_holder_base;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}